

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
trial::protocol::bintoken::
format<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<char>>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          bintoken *this,basic_variable<std::allocator<char>_> *data)

{
  writer writer;
  writer wStack_78;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  basic_writer<16ul>::basic_writer<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_writer<16ul> *)&wStack_78,__return_storage_ptr__);
  partial::format<std::allocator<char>>((basic_variable<std::allocator<char>_> *)this,&wStack_78);
  basic_writer<16UL>::~basic_writer(&wStack_78);
  return __return_storage_ptr__;
}

Assistant:

auto format(const trial::dynamic::basic_variable<Allocator>& data) -> T
{
    T result;
    bintoken::writer writer(result);
    partial::format(data, writer);
    return result;
}